

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bounding_rect.h
# Opt level: O0

bool agg::bounding_rect_single<agg::gsv_text,double>
               (gsv_text *vs,uint path_id,double *x1,double *y1,double *x2,double *y2)

{
  bool bVar1;
  bool bVar2;
  uint c;
  bool local_51;
  uint cmd;
  bool first;
  double y;
  double x;
  double *y2_local;
  double *x2_local;
  double *y1_local;
  double *x1_local;
  gsv_text *pgStack_10;
  uint path_id_local;
  gsv_text *vs_local;
  
  bVar1 = true;
  *x1 = 1.0;
  *y1 = 1.0;
  *x2 = 0.0;
  *y2 = 0.0;
  x = (double)y2;
  y2_local = x2;
  x2_local = y1;
  y1_local = x1;
  x1_local._4_4_ = path_id;
  pgStack_10 = vs;
  gsv_text::rewind(vs,(FILE *)(ulong)path_id);
  while( true ) {
    c = gsv_text::vertex(pgStack_10,&y,(double *)&cmd);
    bVar2 = is_stop(c);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    bVar2 = is_vertex(c);
    if (bVar2) {
      if (bVar1) {
        *y1_local = y;
        *x2_local = _cmd;
        *y2_local = y;
        *(double *)x = _cmd;
        bVar1 = false;
      }
      else {
        if (y < *y1_local) {
          *y1_local = y;
        }
        if (_cmd < *x2_local) {
          *x2_local = _cmd;
        }
        if (*y2_local <= y && y != *y2_local) {
          *y2_local = y;
        }
        if (*(double *)x <= _cmd && _cmd != *(double *)x) {
          *(double *)x = _cmd;
        }
      }
    }
  }
  local_51 = false;
  if (*y1_local <= *y2_local) {
    local_51 = *x2_local <= *(double *)x;
  }
  return local_51;
}

Assistant:

bool bounding_rect_single(VertexSource& vs, unsigned path_id,
                              CoordT* x1, CoordT* y1, CoordT* x2, CoordT* y2)
    {
        double x;
        double y;
        bool first = true;

        *x1 = CoordT(1);
        *y1 = CoordT(1);
        *x2 = CoordT(0);
        *y2 = CoordT(0);

        vs.rewind(path_id);
        unsigned cmd;
        while(!is_stop(cmd = vs.vertex(&x, &y)))
        {
            if(is_vertex(cmd))
            {
                if(first)
                {
                    *x1 = CoordT(x);
                    *y1 = CoordT(y);
                    *x2 = CoordT(x);
                    *y2 = CoordT(y);
                    first = false;
                }
                else
                {
                    if(CoordT(x) < *x1) *x1 = CoordT(x);
                    if(CoordT(y) < *y1) *y1 = CoordT(y);
                    if(CoordT(x) > *x2) *x2 = CoordT(x);
                    if(CoordT(y) > *y2) *y2 = CoordT(y);
                }
            }
        }
        return *x1 <= *x2 && *y1 <= *y2;
    }